

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::QueuedClient::~QueuedClient(QueuedClient *this)

{
  ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pFVar1;
  Disposer *pDVar2;
  PromiseArenaMember *node;
  ClientHook *pCVar3;
  
  pFVar1 = (this->promiseForClientResolution).hub.ptr;
  if (pFVar1 != (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    (this->promiseForClientResolution).hub.ptr =
         (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pDVar2 = (this->promiseForClientResolution).hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pFVar1 = (this->promiseForCallForwarding).hub.ptr;
  if (pFVar1 != (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    (this->promiseForCallForwarding).hub.ptr =
         (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pDVar2 = (this->promiseForCallForwarding).hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  node = &((this->selfResolutionOp).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->selfResolutionOp).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pFVar1 = (this->promise).hub.ptr;
  if (pFVar1 != (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    (this->promise).hub.ptr = (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pDVar2 = (this->promise).hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pCVar3 = (this->redirect).ptr.ptr;
  if (pCVar3 != (ClientHook *)0x0) {
    (this->redirect).ptr.ptr = (ClientHook *)0x0;
    pDVar2 = (this->redirect).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class QueuedClient final: public ClientHook, public kj::Refcounted {
  // A ClientHook which simply queues calls while waiting for a ClientHook to which to forward
  // them.

public:
  QueuedClient(kj::Promise<kj::Own<ClientHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<ClientHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenCap(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)),
        promiseForCallForwarding(promise.addBranch().fork()),
        promiseForClientResolution(promise.addBranch().fork()) {}

  Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }

  VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context, CallHints hints) override {
    if (hints.noPromisePipelining) {
      // Optimize for no pipelining.
      auto promise = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        return client->call(interfaceId, methodId, kj::mv(context), hints).promise;
      });
      return VoidPromiseAndPipeline { kj::mv(promise), getDisabledPipeline() };
    } else if (hints.onlyPromisePipeline) {
      auto pipelinePromise = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        return client->call(interfaceId, methodId, kj::mv(context), hints).pipeline;
      });
      return VoidPromiseAndPipeline {
        kj::NEVER_DONE,
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise))
      };
    } else {
      auto split = promiseForCallForwarding.addBranch()
          .then([=,context=kj::mv(context)](kj::Own<ClientHook>&& client) mutable {
        auto vpap = client->call(interfaceId, methodId, kj::mv(context), hints);
        return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
      }).split();

      kj::Promise<void> completionPromise = kj::mv(kj::get<0>(split));
      kj::Promise<kj::Own<PipelineHook>> pipelinePromise = kj::mv(kj::get<1>(split));

      auto pipeline = kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise));

      // OK, now we can actually return our thing.
      return VoidPromiseAndPipeline { kj::mv(completionPromise), kj::mv(pipeline) };
    }
  }

  kj::Maybe<ClientHook&> getResolved() override {
    KJ_IF_SOME(inner, redirect) {
      return *inner;
    } else {
      return kj::none;
    }
  }

  kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    return promiseForClientResolution.addBranch();
  }